

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O0

unsigned_long
gmlc::utilities::strViewToInteger<unsigned_long>(string_view input,size_t *charactersUsed)

{
  string_view input_00;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_pointer pvVar4;
  const_pointer __last;
  char *pcVar5;
  out_of_range *this;
  unsigned_long uVar6;
  invalid_argument *this_00;
  errc eVar7;
  size_t *in_RDX;
  __integer_from_chars_result_type<unsigned_long> _Var8;
  long signedVal;
  __integer_from_chars_result_type<unsigned_long> conversionResult;
  size_t additionalChars;
  unsigned_long val;
  undefined8 in_stack_ffffffffffffff78;
  unsigned_long *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffffcc;
  size_t sVar9;
  char *pcVar10;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  pcVar10 = (char *)0x0;
  if (in_RDX != (size_t *)0x0) {
    *in_RDX = 0;
  }
  sVar9 = 0;
  sVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  if (1 < sVar2) {
    while (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                              ((basic_string_view<char,_std::char_traits<char>_> *)&local_18,0),
          *pvVar3 == ' ') {
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)&local_18,1);
      sVar9 = sVar9 + 1;
      bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
      if (bVar1) {
        if (in_RDX == (size_t *)0x0) {
          return (unsigned_long)pcVar10;
        }
        *in_RDX = sVar9;
        return (unsigned_long)pcVar10;
      }
    }
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::front
                       ((basic_string_view<char,_std::char_traits<char>_> *)&local_18);
    if (((*pvVar3 == '0') &&
        (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                            ((basic_string_view<char,_std::char_traits<char>_> *)&local_18,1),
        *pvVar3 != 'X')) &&
       (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)&local_18,1),
       *pvVar3 != 'x')) {
      while (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                ((basic_string_view<char,_std::char_traits<char>_> *)&local_18,0),
            *pvVar3 == '0') {
        std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                  ((basic_string_view<char,_std::char_traits<char>_> *)&local_18,1);
        sVar9 = sVar9 + 1;
        bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
        if (bVar1) {
          if (in_RDX != (size_t *)0x0) {
            *in_RDX = sVar9;
          }
          return (unsigned_long)pcVar10;
        }
      }
    }
  }
  pvVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
  __last = CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  _Var8 = CLI::std::from_chars<unsigned_long>
                    (pvVar4,__last,in_stack_ffffffffffffff80,
                     (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  pcVar5 = _Var8.ptr;
  eVar7 = _Var8.ec;
  if (eVar7 == 0) {
    if (in_RDX == (size_t *)0x0) {
      return (unsigned_long)pcVar10;
    }
    pvVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
    *in_RDX = (size_t)(pcVar5 + (sVar9 - (long)pvVar4));
    return (unsigned_long)pcVar10;
  }
  if (eVar7 == result_out_of_range) {
    if (in_RDX != (size_t *)0x0) {
      pvVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
      *in_RDX = (long)pcVar5 - (long)pvVar4;
    }
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this,"conversion type does not support the string conversion");
    __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  sVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  if ((1 < sVar2) &&
     (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::front
                         ((basic_string_view<char,_std::char_traits<char>_> *)&local_18),
     *pvVar3 == '-')) {
    input_00._M_str = pcVar10;
    input_00._M_len = sVar9;
    uVar6 = strViewToInteger<long>(input_00,(size_t *)CONCAT44(in_stack_ffffffffffffffcc,eVar7));
    return uVar6;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"unable to convert string");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

X strViewToInteger(std::string_view input, size_t* charactersUsed = nullptr)
{
    static_assert(std::is_integral_v<X>, "requested type is not integral");
    X val{0};
    if (charactersUsed != nullptr) {
        *charactersUsed = 0;
    }
    std::size_t additionalChars{0};
    if (input.size() > 1) {
        while (input[0] == ' ') {
            input.remove_prefix(1);
            ++additionalChars;
            if (input.empty()) {
                if (charactersUsed != nullptr) {
                    *charactersUsed = additionalChars;
                }
                return val;
            }
        }
        if (input.front() == '0') {
            if (input[1] != 'X' && input[1] != 'x') {
                while (input[0] == '0') {
                    input.remove_prefix(1);
                    ++additionalChars;
                    if (input.empty()) {
                        if (charactersUsed != nullptr) {
                            *charactersUsed = additionalChars;
                        }
                        return val;
                    }
                }
            }
        }
    }
    auto conversionResult =
        std::from_chars(input.data(), input.data() + input.size(), val);
    if (conversionResult.ec == std::errc()) {
        if (charactersUsed != nullptr) {
            *charactersUsed =
                (conversionResult.ptr - input.data()) + additionalChars;
        }
        return val;
    }
    if (conversionResult.ec == std::errc::result_out_of_range) {
        if (charactersUsed != nullptr) {
            *charactersUsed = (conversionResult.ptr - input.data());
        }
        throw(std::out_of_range(
            "conversion type does not support the string conversion"));
    }
    if constexpr (std::is_unsigned_v<X>) {
        if (input.size() > 1 && input.front() == '-') {
            auto signedVal =
                strViewToInteger<std::make_signed_t<X>>(input, charactersUsed);
            // additional chars must be 0 in this case otherwise it should have
            // been an error
            return static_cast<X>(signedVal);
        }
    }
    throw(std::invalid_argument("unable to convert string"));
}